

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

string * __thiscall
cmTarget::ImportedGetFullPath
          (string *__return_storage_ptr__,cmTarget *this,string *config,bool pimplib)

{
  bool bVar1;
  char *pcVar2;
  char *imp;
  char *loc;
  string impProp;
  string suffix;
  string config_upper;
  allocator local_b1;
  char *local_b0;
  char *local_a8;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (this->IsImportedTarget == false) {
    __assert_fail("this->IsImported()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmTarget.cxx"
                  ,0x795,
                  "std::string cmTarget::ImportedGetFullPath(const std::string &, bool) const");
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  if (config->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)&local_40);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_60,config);
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  local_a8 = (char *)0x0;
  local_b0 = (char *)0x0;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_60.field_2._M_local_buf[0] = '\0';
  if (this->TargetTypeValue == INTERFACE_LIBRARY) goto LAB_0036e956;
  bVar1 = GetMappedConfig(this,&local_40,&local_a8,&local_b0,&local_60);
  if (!bVar1) goto LAB_0036e956;
  if (pimplib) {
    if (local_b0 != (char *)0x0) {
LAB_0036e876:
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      goto LAB_0036e956;
    }
    if (this->TargetTypeValue != SHARED_LIBRARY) {
      bVar1 = IsExecutableWithExports(this);
      if (!bVar1) goto LAB_0036e956;
    }
    std::__cxx11::string::string((string *)&local_80,"IMPORTED_IMPLIB",(allocator *)&local_a0);
    std::__cxx11::string::append((string *)&local_80);
    pcVar2 = GetProperty(this,&local_80);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_a0,"IMPORTED_IMPLIB",&local_b1);
      pcVar2 = GetProperty(this,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
      }
    }
    else {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
  }
  else {
    if (local_a8 != (char *)0x0) goto LAB_0036e876;
    std::__cxx11::string::string((string *)&local_80,"IMPORTED_LOCATION",(allocator *)&local_a0);
    std::__cxx11::string::append((string *)&local_80);
    pcVar2 = GetProperty(this,&local_80);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_a0,"IMPORTED_LOCATION",&local_b1);
      pcVar2 = GetProperty(this,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
      }
    }
    else {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::~string((string *)&local_80);
LAB_0036e956:
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmTarget::ImportedGetFullPath(const std::string& config, bool pimplib) const
{
  assert(this->IsImported());

  // Lookup/compute/cache the import information for this
  // configuration.
  std::string config_upper;
  if(!config.empty())
    {
    config_upper = cmSystemTools::UpperCase(config);
    }
  else
    {
    config_upper = "NOCONFIG";
    }

  std::string result;

  const char* loc = 0;
  const char* imp = 0;
  std::string suffix;

  if(this->GetType() != cmState::INTERFACE_LIBRARY
     && this->GetMappedConfig(config_upper, &loc, &imp, suffix))
    {
    if (!pimplib)
      {
      if(loc)
        {
        result = loc;
        }
      else
        {
        std::string impProp = "IMPORTED_LOCATION";
        impProp += suffix;
        if(const char* config_location = this->GetProperty(impProp))
          {
          result = config_location;
          }
        else if(const char* location =
                this->GetProperty("IMPORTED_LOCATION"))
          {
          result = location;
          }
        }
      }
    else
      {
      if(imp)
        {
        result = imp;
        }
      else if(this->GetType() == cmState::SHARED_LIBRARY ||
              this->IsExecutableWithExports())
        {
        std::string impProp = "IMPORTED_IMPLIB";
        impProp += suffix;
        if(const char* config_implib = this->GetProperty(impProp))
          {
          result = config_implib;
          }
        else if(const char* implib = this->GetProperty("IMPORTED_IMPLIB"))
          {
          result = implib;
          }
        }
      }
    }

  if(result.empty())
    {
    result = this->GetName();
    result += "-NOTFOUND";
    }
  return result;
}